

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O2

void Llb_Nonlin4AddPair(Llb_Mgr_t_conflict *p,int iPart,int iVar)

{
  Llb_Var_t **ppLVar1;
  Llb_Var_t *pLVar2;
  Vec_Int_t *pVVar3;
  int nCap;
  
  ppLVar1 = p->pVars;
  pLVar2 = ppLVar1[iVar];
  if (pLVar2 == (Llb_Var_t *)0x0) {
    nCap = 1;
    pLVar2 = (Llb_Var_t *)calloc(1,0x10);
    ppLVar1[iVar] = pLVar2;
    pLVar2 = p->pVars[iVar];
    pLVar2->iVar = iVar;
    pLVar2->nScore = 0;
    pVVar3 = Vec_IntAlloc(nCap);
    ppLVar1 = p->pVars;
    ppLVar1[iVar]->vParts = pVVar3;
    pLVar2 = ppLVar1[iVar];
  }
  Vec_IntPush(pLVar2->vParts,iPart);
  Vec_IntPush(p->pParts[iPart]->vVars,iVar);
  return;
}

Assistant:

void Llb_Nonlin4AddPair( Llb_Mgr_t * p, int iPart, int iVar )
{
    if ( p->pVars[iVar] == NULL )
    {
        p->pVars[iVar] = ABC_CALLOC( Llb_Var_t, 1 );
        p->pVars[iVar]->iVar   = iVar;
        p->pVars[iVar]->nScore = 0;
        p->pVars[iVar]->vParts = Vec_IntAlloc( 8 );
    }
    Vec_IntPush( p->pVars[iVar]->vParts, iPart );
    Vec_IntPush( p->pParts[iPart]->vVars, iVar );
}